

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicCmpxchg
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          AtomicCmpxchg *curr)

{
  byte bVar1;
  Name memoryName;
  Name memory;
  Name memoryName_00;
  undefined1 this_00 [8];
  char cVar2;
  Address memorySize;
  Literal *pLVar3;
  Address addr;
  undefined1 local_1e0 [8];
  Flow ptr;
  Flow replacement;
  Flow expected;
  Literal loaded;
  Literal local_c0;
  Literal local_a8;
  Literal local_90;
  Literal local_78;
  Literal local_60;
  undefined1 local_48 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_1e0,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (ptr.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&replacement.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->expected);
    if (expected.breakTo.super_IString.str._M_len == 0) {
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&ptr.breakTo.super_IString.str._M_str,
                 &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->replacement);
      if (replacement.breakTo.super_IString.str._M_len == 0) {
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_48,this,(Name)(curr->memory).super_IString.str);
        memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memory.super_IString.str._M_len = (size_t)info.instance;
        memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_48,memory);
        this_00 = local_48;
        pLVar3 = Flow::getSingleValue((Flow *)local_1e0);
        ::wasm::Literal::Literal(&local_c0,pLVar3);
        addr = getFinalAddress<wasm::AtomicCmpxchg>
                         ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,&local_c0,memorySize)
        ;
        ::wasm::Literal::~Literal(&local_c0);
        pLVar3 = Flow::getSingleValue((Flow *)&replacement.breakTo.super_IString.str._M_str);
        ::wasm::Literal::Literal(&local_90,pLVar3);
        wrapToSmallerSize(&local_a8,this,&local_90,(uint)curr->bytes);
        Flow::Flow((Flow *)&expected.breakTo.super_IString.str._M_str,&local_a8);
        Flow::operator=((Flow *)&replacement.breakTo.super_IString.str._M_str,
                        (Flow *)&expected.breakTo.super_IString.str._M_str);
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&expected.breakTo.super_IString.str._M_str);
        ::wasm::Literal::~Literal(&local_a8);
        ::wasm::Literal::~Literal(&local_90);
        memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
        memoryName.super_IString.str._M_len = (size_t)info.instance;
        doAtomicLoad((Literal *)&expected.breakTo.super_IString.str._M_str,
                     (ModuleRunnerBase<wasm::ModuleRunner> *)local_48,addr,(uint)curr->bytes,
                     (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)25>).
                           super_Expression.type.id,memoryName,memorySize);
        pLVar3 = Flow::getSingleValue((Flow *)&replacement.breakTo.super_IString.str._M_str);
        cVar2 = ::wasm::Literal::operator==
                          ((Literal *)&expected.breakTo.super_IString.str._M_str,pLVar3);
        if (cVar2 != '\0') {
          bVar1 = curr->bytes;
          pLVar3 = Flow::getSingleValue((Flow *)&ptr.breakTo.super_IString.str._M_str);
          ::wasm::Literal::Literal(&local_78,pLVar3);
          memoryName_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
          memoryName_00.super_IString.str._M_len = (size_t)info.instance;
          doAtomicStore((ModuleRunnerBase<wasm::ModuleRunner> *)local_48,addr,(uint)bVar1,&local_78,
                        memoryName_00,memorySize);
          ::wasm::Literal::~Literal(&local_78);
        }
        ::wasm::Literal::Literal(&local_60,(Literal *)&expected.breakTo.super_IString.str._M_str);
        Flow::Flow(__return_storage_ptr__,&local_60);
        ::wasm::Literal::~Literal(&local_60);
        ::wasm::Literal::~Literal((Literal *)&expected.breakTo.super_IString.str._M_str);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&ptr.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&ptr.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&replacement.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&replacement.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_1e0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicCmpxchg(AtomicCmpxchg* curr) {
    NOTE_ENTER("AtomicCmpxchg");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    NOTE_EVAL1(ptr);
    auto expected = self()->visit(curr->expected);
    if (expected.breaking()) {
      return expected;
    }
    auto replacement = self()->visit(curr->replacement);
    if (replacement.breaking()) {
      return replacement;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), memorySize);
    expected = Flow(wrapToSmallerSize(expected.getSingleValue(), curr->bytes));
    NOTE_EVAL1(addr);
    NOTE_EVAL1(expected);
    NOTE_EVAL1(replacement);
    auto loaded = info.instance->doAtomicLoad(
      addr, curr->bytes, curr->type, info.name, memorySize);
    NOTE_EVAL1(loaded);
    if (loaded == expected.getSingleValue()) {
      info.instance->doAtomicStore(
        addr, curr->bytes, replacement.getSingleValue(), info.name, memorySize);
    }
    return loaded;
  }